

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

void __thiscall
gl4cts::anon_unknown_0::SubroutinesBase::VerifyVS(SubroutinesBase *this,GLuint program,long *error)

{
  CallLogWrapper *this_00;
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  GLint *pGVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  undefined4 in_register_00000034;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  GLsizei length;
  GLenum propsS [1];
  key_type local_10b0;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp;
  GLenum prop;
  GLint expectedS [1];
  GLint expectedU [4];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesS;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  GLenum propsU [4];
  GLint param [1000];
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,CONCAT44(in_register_00000034,program),0x92e8,0x92f5,2,error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,program,0x92e8,0x92f6,2,error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,program,0x92ee,0x92f5,1,error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,program,0x92ee,0x92f6,2,error);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,program,0x92ee,0x92f8,2,error);
  indicesS._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesS._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesS._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesS._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pGVar4 = param + 4;
  indicesS._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesS._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  param._0_8_ = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"x","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,program,0x92e8,&indicesS,param,error);
  if ((GLint *)param._0_8_ != pGVar4) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"y","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,program,0x92e8,&indicesS,param,error);
  if ((GLint *)param._0_8_ != pGVar4) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesU._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  param._0_8_ = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"a","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,program,0x92ee,&indicesU,param,error);
  if ((GLint *)param._0_8_ != pGVar4) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"x","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesS,(key_type *)param);
  uVar6 = *pmVar7;
  pp_Var1 = &exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  exp._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&exp,"x","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,program,0x92e8,(ulong)uVar6,&exp,error);
  if ((_Base_ptr *)exp._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)exp._M_t._M_impl._0_8_,
                    (ulong)((long)&(exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((GLint *)param._0_8_ != pGVar4) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"y","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesS,(key_type *)param);
  uVar6 = *pmVar7;
  exp._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&exp,"y","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,program,0x92e8,(ulong)uVar6,&exp,error);
  if ((_Base_ptr *)exp._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)exp._M_t._M_impl._0_8_,
                    (ulong)((long)&(exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((GLint *)param._0_8_ != pGVar4) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"a","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  uVar6 = *pmVar7;
  exp._M_t._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&exp,"a","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,program,0x92ee,(ulong)uVar6,&exp,error);
  if ((_Base_ptr *)exp._M_t._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)exp._M_t._M_impl._0_8_,
                    (ulong)((long)&(exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((GLint *)param._0_8_ != pGVar4) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"a","");
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  uVar6 = glu::CallLogWrapper::glGetSubroutineUniformLocation(this_00,program,0x8b31,"a");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,program,0x92ee,param,(ulong)uVar6,error);
  if ((GLint *)param._0_8_ != pGVar4) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  propsS[0] = 0x92f9;
  expectedS[0] = 2;
  param._0_8_ = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"x","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesS,(key_type *)param);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,program,0x92e8,(ulong)*pmVar7,1,propsS,1,expectedS,error);
  if ((GLint *)param._0_8_ != pGVar4) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  param._0_8_ = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"y","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesS,(key_type *)param);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,program,0x92e8,(ulong)*pmVar7,1,propsS,1,expectedS,error);
  if ((GLint *)param._0_8_ != pGVar4) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  propsU[0] = 0x92f9;
  propsU[1] = 0x92fb;
  propsU[2] = 0x8e4a;
  propsU[3] = 0x930e;
  expectedU[0] = 2;
  expectedU[1] = 1;
  expectedU[2] = 2;
  expectedU[3] = glu::CallLogWrapper::glGetSubroutineUniformLocation(this_00,program,0x8b31,"a");
  param._0_8_ = pGVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)param,"a","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)param);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,program,0x92ee,(ulong)*pmVar7,4,propsU,4,expectedU,error);
  if ((GLint *)param._0_8_ != pGVar4) {
    operator_delete((void *)param._0_8_,param._16_8_ + 1);
  }
  prop = 0x8e4b;
  p_Var2 = &exp._M_t._M_impl.super__Rb_tree_header;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  exp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar3 = &local_10b0.field_2;
  local_10b0._M_dataplus._M_p = (pointer)paVar3;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  exp._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10b0,"x","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesS,&local_10b0);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&exp,pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_10b0._M_dataplus._M_p,local_10b0.field_2._M_allocated_capacity + 1);
  }
  local_10b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10b0,"y","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesS,&local_10b0);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&exp,pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_10b0._M_dataplus._M_p,local_10b0.field_2._M_allocated_capacity + 1);
  }
  local_10b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10b0,"a","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,&local_10b0);
  glu::CallLogWrapper::glGetProgramResourceiv
            (this_00,program,0x92ee,*pmVar7,1,&prop,1000,&length,param);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_10b0._M_dataplus._M_p,local_10b0.field_2._M_allocated_capacity + 1);
  }
  uVar10 = (ulong)(uint)length;
  if (0 < length) {
    lVar11 = 0;
    do {
      uVar6 = param[lVar11];
      p_Var8 = &p_Var2->_M_header;
      for (p_Var5 = exp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0; p_Var5 = (&p_Var5->_M_left)[bVar12])
      {
        bVar12 = (uint)*(size_t *)(p_Var5 + 1) < uVar6;
        if (!bVar12) {
          p_Var8 = p_Var5;
        }
      }
      p_Var9 = p_Var2;
      if (((_Rb_tree_header *)p_Var8 != p_Var2) &&
         (p_Var9 = (_Rb_tree_header *)p_Var8,
         uVar6 < (uint)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
        p_Var9 = p_Var2;
      }
      if (((int)uVar10 != 2) || (p_Var9 == p_Var2)) {
        anon_unknown_0::Output("Length: %d\n");
        anon_unknown_0::Output
                  ("Unexpected index/length found in active variables of GL_VERTEX_SUBROUTINE_UNIFORM: %d\n"
                   ,(ulong)(uint)param[lVar11]);
        *error = -1;
      }
      lVar11 = lVar11 + 1;
      uVar10 = (ulong)length;
    } while (lVar11 < (long)uVar10);
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&exp._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesU._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesS._M_t);
  return;
}

Assistant:

virtual void inline VerifyVS(GLuint program, long& error)
	{
		VerifyGetProgramInterfaceiv(program, GL_VERTEX_SUBROUTINE, GL_ACTIVE_RESOURCES, 2, error);
		VerifyGetProgramInterfaceiv(program, GL_VERTEX_SUBROUTINE, GL_MAX_NAME_LENGTH, 2, error);

		VerifyGetProgramInterfaceiv(program, GL_VERTEX_SUBROUTINE_UNIFORM, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_VERTEX_SUBROUTINE_UNIFORM, GL_MAX_NAME_LENGTH, 2, error);
		VerifyGetProgramInterfaceiv(program, GL_VERTEX_SUBROUTINE_UNIFORM, GL_MAX_NUM_COMPATIBLE_SUBROUTINES, 2, error);

		std::map<std::string, GLuint> indicesS;
		VerifyGetProgramResourceIndex(program, GL_VERTEX_SUBROUTINE, indicesS, "x", error);
		VerifyGetProgramResourceIndex(program, GL_VERTEX_SUBROUTINE, indicesS, "y", error);
		std::map<std::string, GLuint> indicesU;
		VerifyGetProgramResourceIndex(program, GL_VERTEX_SUBROUTINE_UNIFORM, indicesU, "a", error);

		VerifyGetProgramResourceName(program, GL_VERTEX_SUBROUTINE, indicesS["x"], "x", error);
		VerifyGetProgramResourceName(program, GL_VERTEX_SUBROUTINE, indicesS["y"], "y", error);
		VerifyGetProgramResourceName(program, GL_VERTEX_SUBROUTINE_UNIFORM, indicesU["a"], "a", error);

		VerifyGetProgramResourceLocation(program, GL_VERTEX_SUBROUTINE_UNIFORM, "a",
										 glGetSubroutineUniformLocation(program, GL_VERTEX_SHADER, "a"), error);

		GLenum propsS[]	= { GL_NAME_LENGTH };
		GLint  expectedS[] = { 2 };
		VerifyGetProgramResourceiv(program, GL_VERTEX_SUBROUTINE, indicesS["x"], 1, propsS, 1, expectedS, error);
		VerifyGetProgramResourceiv(program, GL_VERTEX_SUBROUTINE, indicesS["y"], 1, propsS, 1, expectedS, error);

		GLenum propsU[]	= { GL_NAME_LENGTH, GL_ARRAY_SIZE, GL_NUM_COMPATIBLE_SUBROUTINES, GL_LOCATION };
		GLint  expectedU[] = { 2, 1, 2, glGetSubroutineUniformLocation(program, GL_VERTEX_SHADER, "a") };
		VerifyGetProgramResourceiv(program, GL_VERTEX_SUBROUTINE_UNIFORM, indicesU["a"], 4, propsU, 4, expectedU,
								   error);

		GLenum			 prop	= GL_COMPATIBLE_SUBROUTINES;
		const GLsizei	bufSize = 1000;
		GLint			 param[bufSize];
		GLsizei			 length;
		std::set<GLuint> exp;
		exp.insert(indicesS["x"]);
		exp.insert(indicesS["y"]);
		glGetProgramResourceiv(program, GL_VERTEX_SUBROUTINE_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, param);
		for (int i = 0; i < length; ++i)
		{
			if (exp.find(param[i]) == exp.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of GL_VERTEX_SUBROUTINE_UNIFORM: %d\n",
					   param[i]);
				error = ERROR;
			}
		}
	}